

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu541.c
# Opt level: O0

void hal_h265e_v540_set_uniform_tile
               (H265eV541RegSet *regs,H265eSyntax_new *syn,RK_U32 index,RK_S32 tile_start_x)

{
  ushort uVar1;
  uint uVar2;
  RK_U32 RVar3;
  RK_U32 tmp;
  RK_S32 tile_width;
  RK_S32 mb_h;
  RK_S32 tile_start_x_local;
  RK_U32 index_local;
  H265eSyntax_new *syn_local;
  H265eV541RegSet *regs_local;
  
  if (((syn->pp).field_22.CodingSettingPicturePropertyFlags >> 7 & 1) != 0) {
    uVar1 = (syn->pp).pic_height;
    uVar2 = (syn->pp).column_width_minus1[index];
    regs->tile_cfg =
         (anon_struct_4_5_07ce1e9e_for_tile_cfg)((uint)regs->tile_cfg & 0xffffffc0 | uVar2 & 0x3f);
    regs->tile_cfg =
         (anon_struct_4_5_07ce1e9e_for_tile_cfg)
         ((uint)regs->tile_cfg & 0xffc0ffff |
         ((int)(((long)(int)(uVar1 + 0x3f) & 0xffffffffffffffc0U) / 0x40) - 1U & 0x3f) << 0x10);
    regs->rc_cfg = (anon_struct_4_5_acb2c23c_for_rc_cfg)
                   ((uint)regs->rc_cfg & 0xffff | (uVar2 + 1) * 0x10000);
    regs->tile_cfg =
         (anon_struct_4_5_07ce1e9e_for_tile_cfg)
         ((uint)regs->tile_cfg & 0x7fffffff |
         ((syn->pp).field_22.CodingSettingPicturePropertyFlags >> 7) << 0x1f);
    regs->tile_pos =
         (anon_struct_4_4_34e5ed23_for_tile_pos)
         ((uint)regs->tile_pos & 0xffffffc0 | tile_start_x & 0x3fU);
    regs->tile_pos = (anon_struct_4_4_34e5ed23_for_tile_pos)((uint)regs->tile_pos & 0xffc0ffff);
    if (index != 0) {
      RVar3 = regs->lpfr_addr_hevc;
      regs->lpfr_addr_hevc = regs->lpfw_addr_hevc;
      regs->lpfw_addr_hevc = RVar3;
    }
    if ((hal_h265e_debug & 8) != 0) {
      _mpp_log_l(4,"hal_h265e_v541","tile_x %d, rc_ctu_num %d, tile_width_m1 %d",(char *)0x0,
                 (ulong)((uint)regs->tile_pos & 0x3f),(ulong)((uint)regs->rc_cfg >> 0x10),
                 (uint)regs->tile_cfg & 0x3f);
    }
  }
  return;
}

Assistant:

void hal_h265e_v540_set_uniform_tile(H265eV541RegSet *regs, H265eSyntax_new *syn,
                                     RK_U32 index, RK_S32 tile_start_x)
{
    if (syn->pp.tiles_enabled_flag) {
        RK_S32 mb_h = MPP_ALIGN(syn->pp.pic_height, 64) / 64;
        RK_S32 tile_width = syn->pp.column_width_minus1[index] + 1;

        regs->tile_cfg.tile_width_m1 = tile_width - 1;
        regs->tile_cfg.tile_height_m1 = mb_h - 1;
        regs->rc_cfg.rc_ctu_num   = tile_width;
        regs->tile_cfg.tile_en = syn->pp.tiles_enabled_flag;
        regs->tile_pos.tile_x = tile_start_x;
        regs->tile_pos.tile_y = 0;
        if (index > 0) {
            RK_U32 tmp = regs->lpfr_addr_hevc;
            regs->lpfr_addr_hevc = regs->lpfw_addr_hevc;
            regs->lpfw_addr_hevc = tmp;
        }

        hal_h265e_dbg_detail("tile_x %d, rc_ctu_num %d, tile_width_m1 %d",
                             regs->tile_pos.tile_x, regs->rc_cfg.rc_ctu_num,
                             regs->tile_cfg.tile_width_m1);
    }
}